

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

bool Cipher::beamSearch(TParameters *params,TFreqMap *freqMap,TResult *result)

{
  value_type vVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pvVar5;
  mapped_type *pmVar6;
  reference pvVar7;
  int *piVar8;
  iterator iVar9;
  iterator iVar10;
  reference pvVar11;
  reference pvVar12;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  float fVar13;
  TProb TVar14;
  int j_2;
  int j_1;
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> sortedNew;
  int idx1;
  int idx0;
  value_type idx;
  int k;
  value_type *hnew;
  int a;
  value_type *hcur_1;
  int j;
  int nNew;
  value_type *kvSorted;
  int i_2;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> *kv;
  iterator __end2;
  iterator __begin2;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range2;
  int i_1;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  counts;
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  sorted;
  int i;
  value_type *hcur;
  vector<THypothesis,_std::allocator<THypothesis>_> hypothesesNew;
  vector<THypothesis,_std::allocator<THypothesis>_> hypothesesCur;
  int nCur;
  int nHypothesesToKeep;
  int nSymbols;
  int N;
  TClusters *clusters;
  THypothesis *in_stack_fffffffffffffcc8;
  reference in_stack_fffffffffffffcd0;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffffcd8;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffffce0;
  pair<int,_float> in_stack_fffffffffffffce8;
  TProb in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  TClusters *in_stack_fffffffffffffcf8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffd10;
  int local_268;
  int local_244;
  pointer in_stack_fffffffffffffdc0;
  pointer in_stack_fffffffffffffdc8;
  pointer in_stack_fffffffffffffdd0;
  TParameters *in_stack_fffffffffffffdd8;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec [3];
  int local_1e0;
  int local_1dc;
  reference local_1d8;
  int local_1cc;
  reference local_1c8;
  int local_1c0;
  int local_1bc;
  reference local_1b8;
  int local_1b0;
  pair<int,_std::vector<int,_std::allocator<int>_>_> *local_1a8;
  pair<int,_std::vector<int,_std::allocator<int>_>_> *local_1a0;
  reference local_178;
  _Self local_170;
  _Self local_168;
  undefined1 *local_160;
  int local_154;
  undefined1 local_150 [48];
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_120;
  undefined4 local_108;
  int local_104;
  undefined1 local_ff;
  undefined1 local_fe;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined1 auStack_90 [24];
  reference local_78;
  vector<THypothesis,_std::allocator<THypothesis>_> local_60;
  vector<THypothesis,_std::allocator<THypothesis>_> local_48;
  int local_30;
  int local_2c [3];
  vector<int,_std::allocator<int>_> *local_20;
  long local_18;
  int *local_10;
  long local_8;
  
  local_20 = (vector<int,_std::allocator<int>_> *)(in_RDX + 0x40);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar4 = std::vector<int,_std::allocator<int>_>::size(local_20);
  local_2c[2] = (int)sVar4;
  local_2c[1] = 0x1b;
  local_2c[0] = *(int *)(local_8 + 0x24);
  local_30 = 0;
  std::vector<THypothesis,_std::allocator<THypothesis>_>::vector
            ((vector<THypothesis,_std::allocator<THypothesis>_> *)0x1b87d4);
  std::vector<THypothesis,_std::allocator<THypothesis>_>::vector
            ((vector<THypothesis,_std::allocator<THypothesis>_> *)0x1b87e1);
  std::vector<THypothesis,_std::allocator<THypothesis>_>::resize
            ((vector<THypothesis,_std::allocator<THypothesis>_> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (size_type)in_stack_fffffffffffffce8);
  std::vector<THypothesis,_std::allocator<THypothesis>_>::resize
            ((vector<THypothesis,_std::allocator<THypothesis>_> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (size_type)in_stack_fffffffffffffce8);
  local_78 = std::vector<THypothesis,_std::allocator<THypothesis>_>::operator[](&local_48,0);
  local_f8 = 0;
  getNullCLMap(in_stack_fffffffffffffcf8);
  local_ff = 1;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b8892);
  local_fe = 1;
  local_fc = 0;
  std::allocator<int>::allocator((allocator<int> *)0x1b88ca);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (size_type)in_stack_fffffffffffffce8,
             (value_type_conflict2 *)in_stack_fffffffffffffce0._M_current,
             (allocator_type *)in_stack_fffffffffffffcd8._M_current);
  memset(auStack_90,0,0x18);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x1b891b);
  local_fe = 0;
  local_ff = 0;
  beamSearch::THypothesis::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  beamSearch::THypothesis::~THypothesis(in_stack_fffffffffffffcd0);
  std::allocator<int>::~allocator((allocator<int> *)0x1b895a);
  for (local_104 = 0; iVar2 = local_104,
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(local_8 + 0x28)), iVar2 < (int)sVar4;
      local_104 = local_104 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_8 + 0x28),(long)local_104);
    if ((*pvVar5 != -1) && (fVar13 = frand(), 0.5 < fVar13)) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_8 + 0x28),(long)local_104);
      vVar1 = *pvVar5;
      std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_104);
      pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](in_stack_fffffffffffffd10,
                          (key_type_conflict *)
                          CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      *pmVar6 = vVar1;
    }
  }
  translate((TClusterToLetterMap *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
            (TClusters *)in_stack_fffffffffffffce8,
            (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce0._M_current);
  local_108 = 0x3f800000;
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_fffffffffffffd00,(size_type)in_stack_fffffffffffffcf8,
             (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  TVar14 = calcScore(in_stack_fffffffffffffdd8,(TFreqMap *)in_stack_fffffffffffffdd0,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc8,
                     (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdc0);
  local_78->p = TVar14;
  local_30 = local_30 + 1;
  std::
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::vector((vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
            *)0x1b8ba0);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)0x1b8bad);
  for (local_154 = 0; iVar2 = local_154,
      sVar4 = std::vector<int,_std::allocator<int>_>::size(local_20), iVar2 < (int)sVar4;
      local_154 = local_154 + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](local_20,(long)local_154);
    std::
    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)in_stack_fffffffffffffd10,
                 (key_type_conflict *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08))
    ;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce0._M_current,
               (value_type_conflict2 *)in_stack_fffffffffffffcd8._M_current);
  }
  local_160 = local_150;
  local_168._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::begin((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                *)in_stack_fffffffffffffcc8);
  local_170._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::end((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)in_stack_fffffffffffffcc8);
  while (bVar3 = std::operator!=(&local_168,&local_170), bVar3) {
    local_178 = std::
                _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
                operator*((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                           *)0x1b8cae);
    std::make_pair<int_const&,std::vector<int,std::allocator<int>>&>
              ((int *)in_stack_fffffffffffffcd8._M_current,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcd0);
    std::
    vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::push_back((vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
    std::pair<int,_std::vector<int,_std::allocator<int>_>_>::~pair
              ((pair<int,_std::vector<int,_std::allocator<int>_>_> *)0x1b8cf8);
    std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
    operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> *)
               in_stack_fffffffffffffcd0);
  }
  local_1a0 = (pair<int,_std::vector<int,_std::allocator<int>_>_> *)
              std::
              vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::begin((vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       *)in_stack_fffffffffffffcc8);
  local_1a8 = (pair<int,_std::vector<int,_std::allocator<int>_>_> *)
              std::
              vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::end((vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                     *)in_stack_fffffffffffffcc8);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<int,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<int,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int,std::vector<int,std::allocator<int>>>>>>,Cipher::beamSearch(Cipher::TParameters_const&,Cipher::TFreqMap_const&,Cipher::TResult&)::__0>
            (local_1a0,local_1a8);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)0x1b8d80);
  for (local_1b0 = 0; iVar2 = local_1b0,
      sVar4 = std::
              vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::size(&local_120), iVar2 < (int)sVar4; local_1b0 = local_1b0 + 1) {
    local_1b8 = std::
                vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&local_120,(long)local_1b0);
    bVar3 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce0._M_current);
    if (bVar3) break;
    std::vector<THypothesis,_std::allocator<THypothesis>_>::operator[](&local_48,0);
    pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                        (key_type_conflict *)in_stack_fffffffffffffce8);
    if (*pmVar6 == 0) {
      local_1bc = 0;
      for (local_1c0 = 0; local_1c0 < local_30; local_1c0 = local_1c0 + 1) {
        local_1c8 = std::vector<THypothesis,_std::allocator<THypothesis>_>::operator[]
                              (&local_48,(long)local_1c0);
        for (local_1cc = 1; local_1cc < 0x1c; local_1cc = local_1cc + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_1c8->nused,(long)local_1cc);
          if (*pvVar5 < 0x15) {
            sVar4 = (size_type)local_1bc;
            local_1bc = local_1bc + 1;
            local_1d8 = std::vector<THypothesis,_std::allocator<THypothesis>_>::operator[]
                                  (&local_60,sVar4);
            beamSearch::THypothesis::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_1d8->nused,(long)local_1cc);
            *pvVar7 = *pvVar7 + 1;
            for (local_1dc = 0; iVar2 = local_1dc,
                sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_1b8->second),
                iVar2 < (int)sVar4; local_1dc = local_1dc + 1) {
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&local_1b8->second,(long)local_1dc);
              local_1e0 = *pvVar7;
              in_stack_fffffffffffffd0c = local_1cc;
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&local_1d8->plain,(long)local_1e0);
              *pvVar7 = in_stack_fffffffffffffd0c;
              local_1ec[1] = 0;
              local_1ec[0] = (local_1e0 - *local_10) + 1;
              in_stack_fffffffffffffd10 =
                   (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   std::max<int>(local_1ec + 1,local_1ec);
              local_1ec[2] = *(int *)&(in_stack_fffffffffffffd10->_M_t)._M_impl;
              local_1f4 = local_2c[2] + -1;
              local_1f8 = local_1e0 + -1 + *local_10;
              piVar8 = std::min<int>(&local_1f4,&local_1f8);
              local_1f0 = *piVar8;
              std::vector<float,_std::allocator<float>_>::begin
                        ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcc8);
              __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
              operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                        in_stack_fffffffffffffcd8._M_current,
                        (difference_type)in_stack_fffffffffffffcd0);
              std::vector<float,_std::allocator<float>_>::begin
                        ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffcc8);
              __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
              operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                        in_stack_fffffffffffffcd8._M_current,
                        (difference_type)in_stack_fffffffffffffcd0);
              __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
              operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                        in_stack_fffffffffffffcd8._M_current,
                        (difference_type)in_stack_fffffffffffffcd0);
              in_stack_fffffffffffffdd8 = (TParameters *)0x3ff0000000000000;
              std::
              fill<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                        (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                         (double *)in_stack_fffffffffffffcd0);
            }
            in_stack_fffffffffffffcf4 = local_1cc;
            pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[](in_stack_fffffffffffffd10,
                                  (key_type_conflict *)
                                  CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
            *pmVar6 = in_stack_fffffffffffffcf4;
            in_stack_fffffffffffffcf0 =
                 calcScore(in_stack_fffffffffffffdd8,(TFreqMap *)in_stack_fffffffffffffdd0,
                           (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc8,
                           (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdc0);
            local_1d8->p = in_stack_fffffffffffffcf0;
          }
        }
      }
      std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::vector
                ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)0x1b91e2)
      ;
      for (local_244 = 0; local_244 < local_1bc; local_244 = local_244 + 1) {
        std::vector<THypothesis,_std::allocator<THypothesis>_>::operator[]
                  (&local_60,(long)local_244);
        in_stack_fffffffffffffce8 =
             std::make_pair<int&,float&>((int *)in_stack_fffffffffffffcc8,(float *)0x1b9226);
        std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::push_back
                  ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)
                   in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
      }
      in_stack_fffffffffffffce0._M_current = (float *)&stack0xfffffffffffffdc0;
      iVar9 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::begin
                        ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)
                         in_stack_fffffffffffffcc8);
      iVar10 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::end
                         ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)
                          in_stack_fffffffffffffcc8);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<int,float>*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>,Cipher::beamSearch(Cipher::TParameters_const&,Cipher::TFreqMap_const&,Cipher::TResult&)::__1>
                (iVar9._M_current,iVar10._M_current);
      in_stack_fffffffffffffcd8._M_current = (float *)std::min<int>(local_2c,&local_1bc);
      local_30 = (int)*in_stack_fffffffffffffcd8._M_current;
      for (local_268 = 0; local_268 < local_30; local_268 = local_268 + 1) {
        pvVar11 = std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  operator[]((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                              *)&stack0xfffffffffffffdc0,(long)local_268);
        in_stack_fffffffffffffcd0 =
             std::vector<THypothesis,_std::allocator<THypothesis>_>::operator[]
                       (&local_60,(long)pvVar11->first);
        std::vector<THypothesis,_std::allocator<THypothesis>_>::operator[]
                  (&local_48,(long)local_268);
        beamSearch::THypothesis::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      }
      std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::~vector
                ((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)
                 in_stack_fffffffffffffce0._M_current);
    }
  }
  std::vector<THypothesis,_std::allocator<THypothesis>_>::operator[](&local_48,0);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator=
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             in_stack_fffffffffffffcd0,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             in_stack_fffffffffffffcc8);
  pvVar12 = std::vector<THypothesis,_std::allocator<THypothesis>_>::operator[](&local_48,0);
  *(TProb *)(local_18 + 4) = pvVar12->p;
  std::
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)in_stack_fffffffffffffce0._M_current);
  std::vector<THypothesis,_std::allocator<THypothesis>_>::~vector
            ((vector<THypothesis,_std::allocator<THypothesis>_> *)
             in_stack_fffffffffffffce0._M_current);
  std::vector<THypothesis,_std::allocator<THypothesis>_>::~vector
            ((vector<THypothesis,_std::allocator<THypothesis>_> *)
             in_stack_fffffffffffffce0._M_current);
  return true;
}

Assistant:

bool beamSearch(
        const TParameters & params,
        const TFreqMap & freqMap,
        TResult & result) {
        const auto & clusters = result.clusters;

        struct THypothesis {
            TProb p;
            TClusterToLetterMap clMap;
            std::vector<TLetter> plain;
            std::vector<int> nused;
            std::vector<TProb> memo;
        };

        const int N = clusters.size();
        const int nSymbols = 27;
        const int nHypothesesToKeep = params.nHypothesesToKeep;

        int nCur = 0;
        std::vector<THypothesis> hypothesesCur;
        std::vector<THypothesis> hypothesesNew;
        hypothesesCur.resize(nHypothesesToKeep);
        hypothesesNew.resize(nHypothesesToKeep*nSymbols);

        {
            auto & hcur = hypothesesCur[0];
            hcur = { 0.0, getNullCLMap(clusters), {}, std::vector<int>(nSymbols + 1, 0), {}};
            for (int i = 0; i < (int) params.hint.size(); ++i) {
                if (params.hint[i] != -1) {
                    if (frand() > 0.5) {
                        hcur.clMap[clusters[i]] = params.hint[i];
                    }
                }
            }
            translate(hcur.clMap, clusters, hcur.plain);
            hcur.memo.resize(N, 1.0);
            hcur.p = calcScore(params, freqMap, hcur.plain, hcur.memo);
            ++nCur;
        }

        // sorted clusters by frequency
        std::vector<std::pair<TClusterId, std::vector<int>>> sorted;

        {
            std::map<TClusterId, std::vector<int>> counts;
            for (int i = 0; i < (int) clusters.size(); ++i) {
                counts[clusters[i]].push_back(i);
            }

            for (auto & kv : counts) {
                sorted.push_back(std::make_pair(kv.first, kv.second));
            }
            std::sort(sorted.begin(), sorted.end(), [](const auto & a, const auto & b) {
                return a.second.size() > b.second.size();
            });
        }

        for (int i = 0; i < (int) sorted.size(); ++i) {
            auto & kvSorted = sorted[i];
            if (kvSorted.second.empty()) break;

            //printf("Processing cluster %2d ('%c') - count = %d\n", kvSorted.first, getEncodedChar(kvSorted.first), (int) kvSorted.second.size());

            if (hypothesesCur[0].clMap.at(kvSorted.first) != 0) {
                continue;
            }

            int nNew = 0;
            for (int j = 0; j < nCur; ++j) {
                const auto & hcur = hypothesesCur[j];

                for (int a = 1; a <= nSymbols; ++a) {
                    // TODO: maybe become parameter
                    // how many clusters can map to the same symbol
                    if (hcur.nused[a] > 20) continue;

                    auto & hnew = hypothesesNew[nNew++];

                    hnew = hcur;
                    hnew.nused[a]++;
                    for (int k = 0; k < (int) kvSorted.second.size(); ++k) {
                        const auto idx = kvSorted.second[k];
                        hnew.plain[idx] = a;

                        const auto idx0 = std::max(0, idx - freqMap.len + 1);
                        const auto idx1 = std::min(N - 1, idx + freqMap.len - 1);
                        std::fill(hnew.memo.begin() + idx0, hnew.memo.begin() + idx1 + 1, 1.0);
                    }
                    hnew.clMap[kvSorted.first] = a;
                    hnew.p = calcScore(params, freqMap, hnew.plain, hnew.memo);
                }
            }

            // sort hypothesesNew by p
            {
                std::vector<std::pair<int, TProb>> sortedNew;
                for (int j = 0; j < nNew; ++j) {
                    sortedNew.push_back(std::make_pair(j, hypothesesNew[j].p));
                }
                std::sort(sortedNew.begin(), sortedNew.end(), [](const auto & a, const auto & b) {
                    return a.second > b.second;
                });

                //printf("Top p = %g\n", (double) hypothesesNew[sortedNew[0].first].p);
                //printDecoded(clusters, hypothesesNew[sortedNew[0].first].clMap);

                nCur = std::min(nHypothesesToKeep, nNew);
                for (int j = 0; j < nCur; ++j) {
                    hypothesesCur[j] = std::move(hypothesesNew[sortedNew[j].first]);
                }
            }
        }

        result.clMap = hypothesesCur[0].clMap;
        result.p = hypothesesCur[0].p;

        return true;
    }